

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureGenerationSpec::TextureLevelSpec::TextureLevelSpec
          (TextureLevelSpec *this)

{
  TextureLevelSpec *this_local;
  
  this->width = 0;
  this->height = 0;
  this->depth = 0;
  this->level = 0;
  this->internalFormat = 0x1908;
  this->compressed = false;
  return;
}

Assistant:

TextureLevelSpec (void)
			: width				(0)
			, height			(0)
			, depth				(0)
			, level				(0)
			, internalFormat	(GL_RGBA)
			, compressed		(false)
		{
		}